

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::SymlinkCommand::getVerboseDescription
          (SymlinkCommand *this,SmallVectorImpl<char> *result)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  raw_ostream *prVar4;
  void *pvVar5;
  long local_100;
  ulong local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [8];
  StringRef outputPath;
  raw_svector_ostream os;
  SmallVectorImpl<char> *result_local;
  SymlinkCommand *this_local;
  void *P_1;
  size_t FindBegin_1;
  char local_51;
  long *local_50;
  long local_48;
  void *local_40;
  void *P;
  size_t FindBegin;
  char local_21;
  undefined1 *local_20;
  long local_18;
  undefined1 *local_10;
  
  llvm::raw_svector_ostream::raw_svector_ostream((raw_svector_ostream *)&outputPath.Length,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,"ln -sfh ");
  _local_d0 = getActualOutputPath(this);
  bVar2 = std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::empty(&(this->super_Command).outputs);
  if (!bVar2) {
    local_10 = local_d0;
    if (outputPath.Data == (char *)0x0) {
      llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,"<<<missing output>>>");
      goto LAB_0012e2f5;
    }
  }
  local_20 = local_d0;
  local_21 = ' ';
  FindBegin = 0;
  puVar3 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&outputPath);
  P = (void *)*puVar3;
  if (P < outputPath.Data) {
    local_40 = memchr((char *)((long)local_d0 + (long)P),(int)local_21,
                      (long)outputPath.Data - (long)P);
    if (local_40 == (void *)0x0) goto LAB_0012e249;
    local_18 = (long)local_40 - (long)local_d0;
  }
  else {
LAB_0012e249:
    local_18 = -1;
  }
  if (local_18 == -1) {
    local_f0 = (char *)local_d0;
    local_e8 = outputPath.Data;
    llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,_local_d0);
  }
  else {
    prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,'\"');
    local_e0 = (char *)local_d0;
    local_d8 = outputPath.Data;
    prVar4 = llvm::raw_ostream::operator<<(prVar4,_local_d0);
    llvm::raw_ostream::operator<<(prVar4,'\"');
  }
LAB_0012e2f5:
  llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,' ');
  local_100 = std::__cxx11::string::data();
  local_f8 = std::__cxx11::string::length();
  local_50 = &local_100;
  local_51 = ' ';
  FindBegin_1 = 0;
  puVar3 = std::min<unsigned_long>(&FindBegin_1,&local_f8);
  uVar1 = *puVar3;
  if ((uVar1 < local_f8) &&
     (pvVar5 = memchr((void *)(local_100 + uVar1),(int)local_51,local_f8 - uVar1),
     pvVar5 != (void *)0x0)) {
    local_48 = (long)pvVar5 - local_100;
  }
  else {
    local_48 = -1;
  }
  if (local_48 == -1) {
    llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,&this->contents);
  }
  else {
    prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)&outputPath.Length,'\"');
    prVar4 = llvm::raw_ostream::operator<<(prVar4,&this->contents);
    llvm::raw_ostream::operator<<(prVar4,'\"');
  }
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)&outputPath.Length);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "ln -sfh ";
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || !outputPath.empty()) {
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (outputPath.find(' ') != StringRef::npos) {
        os << '"' << outputPath << '"';
      } else {
        os << outputPath;
      }
    } else {
      os << "<<<missing output>>>";
    }
    os << ' ';
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(contents).find(' ') != StringRef::npos) {
      os << '"' << contents << '"';
    } else {
      os << contents;
    }
  }